

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 8_arr_func_range.cpp
# Opt level: O0

int arr_func_range(void)

{
  int iVar1;
  ostream *poVar2;
  void *this;
  int iStack_28;
  int sum;
  int cookies [8];
  
  _iStack_28 = 0x200000001;
  cookies[0] = 4;
  cookies[1] = 8;
  cookies[2] = 0x10;
  cookies[3] = 0x20;
  cookies[4] = 0x40;
  cookies[5] = 0x80;
  poVar2 = std::operator<<((ostream *)&std::cout,"Yeah, let\'s start!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = sum_arr_by_range(&iStack_28,cookies + 6);
  poVar2 = std::operator<<((ostream *)&std::cout,"Total cookies eaten: ");
  this = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  iVar1 = sum_arr_by_range(&iStack_28,cookies + 1);
  poVar2 = std::operator<<((ostream *)&std::cout,"First three eaters ate ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," cookies ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = sum_arr_by_range(cookies + 2,cookies + 6);
  poVar2 = std::operator<<((ostream *)&std::cout,"Last four eaters ate ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," cookies ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int arr_func_range() {
    using namespace std;
    int cookies[ArSize] = {1, 2, 4,  8, 16, 32, 64, 128};

    cout << "Yeah, let's start!" << endl;
    // cookies are actually *address*
    int sum = sum_arr_by_range(cookies, cookies + ArSize);
    cout << "Total cookies eaten: " << sum << endl;
    sum = sum_arr_by_range(cookies, cookies + 3);
    cout << "First three eaters ate " << sum << " cookies " << endl;
    sum = sum_arr_by_range(cookies + 4, cookies + 8);
    cout << "Last four eaters ate " << sum << " cookies " << endl;
    return 0;
}